

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

void __thiscall
ddd::DaTrie<true,_true,_false>::change_branch_(DaTrie<true,_true,_false> *this,Query *query)

{
  vector<char,_std::allocator<char>_> *this_00;
  pointer *ppcVar1;
  byte bVar2;
  pointer pBVar3;
  pointer pNVar4;
  iterator iVar5;
  pointer pcVar6;
  char cVar7;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  uint uVar11;
  Bc BVar12;
  long lVar13;
  Edge edge;
  byte local_141;
  Bc local_140;
  Edge local_138;
  
  memset(&local_138,0,0x108);
  edge_(this,query->node_pos_,&local_138,2);
  if (local_138.size_ == 1) {
    pBVar3 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = (uint)local_138.labels_[0] ^ *(uint *)(pBVar3 + query->node_pos_) & 0x7fffffff;
    BVar12 = pBVar3[uVar11];
    if (BVar12._0_4_ < 0) {
      unfix_(this,uVar11,&this->blocks_);
      if (query->node_pos_ == 0) {
        uVar9 = 0;
        lVar13 = 0;
      }
      else {
        lVar13 = 0;
        uVar11 = query->node_pos_;
        local_140 = BVar12;
        do {
          pBVar3 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                   super__Vector_impl_data._M_start;
          BVar12 = pBVar3[uVar11];
          uVar9 = (ulong)BVar12 >> 0x20 & 0x7fffffff;
          uVar8 = SUB84(pBVar3[uVar9],0);
          if ((((int)uVar8 < 0) || (uVar8 = uVar8 & 0x7fffffff, uVar8 == 0x7fffffff)) ||
             (pNVar4 = (this->node_links_).
                       super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl.
                       super__Vector_impl_data._M_start, bVar2 = pNVar4[uVar9].child,
             pNVar4[uVar8 ^ bVar2].sib != bVar2)) goto LAB_0011dba7;
          uVar8 = BVar12._4_4_ & 0x7fffffff;
          delete_sib_(this,uVar11);
          unfix_(this,query->node_pos_,&this->blocks_);
          query->node_pos_ = uVar8;
          query->is_finished_ = false;
          query->pos_ = query->pos_ - 1;
          lVar13 = lVar13 + 1;
          uVar11 = uVar8;
        } while (((ulong)BVar12 & 0x7fffffff00000000) != 0);
        uVar11 = 0;
LAB_0011dba7:
        uVar9 = (ulong)uVar11;
        BVar12 = local_140;
      }
      pBVar3 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
      this_00 = &this->tail_;
      pBVar3[uVar9] =
           (Bc)(CONCAT44(*(undefined4 *)&pBVar3[uVar9].field_0x4,
                         *(int *)&(this->tail_).super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                         *(int *)&(this->tail_).super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_start) | 0x80000000);
      if (lVar13 != 0) {
        pcVar10 = query->key_;
        uVar11 = query->pos_;
        do {
          iVar5._M_current =
               (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)this_00,iVar5,pcVar10 + uVar11);
          }
          else {
            *iVar5._M_current = pcVar10[uVar11];
            ppcVar1 = &(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          lVar13 = lVar13 + -1;
          pcVar10 = query->key_;
          uVar8 = query->pos_;
          uVar11 = uVar8 + 1;
          query->pos_ = uVar11;
          query->is_finished_ = pcVar10[uVar8] == '\0';
        } while (lVar13 != 0);
      }
      local_141 = local_138.labels_[0];
      iVar5._M_current =
           (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                  (this_00,iVar5,(char *)&local_141);
      }
      else {
        *iVar5._M_current = local_138.labels_[0];
        ppcVar1 = &(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
      }
      uVar9 = (ulong)(BVar12._0_4_ & 0x7fffffff);
      if (local_138.labels_[0] == 0) {
        lVar13 = 4;
        do {
          local_141 = (byte)uVar9;
          iVar5._M_current =
               (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                      (this_00,iVar5,(char *)&local_141);
          }
          else {
            *iVar5._M_current = local_141;
            ppcVar1 = &(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          uVar9 = uVar9 >> 8;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      else {
        uVar11 = BVar12._0_4_ & 0x7fffffff;
        pcVar6 = (this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar10 = pcVar6 + uVar11;
        cVar7 = pcVar6[uVar11];
        while (cVar7 != '\0') {
          iVar5._M_current =
               (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)this_00,iVar5,pcVar10);
          }
          else {
            *iVar5._M_current = cVar7;
            ppcVar1 = &(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          uVar9 = (ulong)((int)uVar9 + 1);
          this->tail_emps_ = this->tail_emps_ + 1;
          pcVar6 = (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pcVar10 = pcVar6 + uVar9;
          cVar7 = pcVar6[uVar9];
        }
        iVar5._M_current =
             (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    ((vector<char,std::allocator<char>> *)this_00,iVar5,pcVar10);
        }
        else {
          *iVar5._M_current = '\0';
          ppcVar1 = &(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        this->tail_emps_ = this->tail_emps_ + 1;
        lVar13 = 0;
        do {
          pcVar10 = (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start + (uint)((int)lVar13 + (int)uVar9 + 1);
          iVar5._M_current =
               (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)this_00,iVar5,pcVar10);
          }
          else {
            *iVar5._M_current = *pcVar10;
            ppcVar1 = &(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          this->tail_emps_ = this->tail_emps_ + 1;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 4);
      }
    }
  }
  return;
}

Assistant:

void change_branch_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    Edge edge;
    edge_(query.node_pos(), edge, 2);

    if (edge.size() != 1) {
      return;
    }

    auto child_pos = bc_[query.node_pos()].base() ^*edge.begin();
    if (!bc_[child_pos].is_leaf()) {
      return;
    }

    auto value = bc_[child_pos].value();
    unfix_(child_pos, blocks_);

    size_t num_regress = 0;
    while (query.node_pos() != ROOT_POS) {
      auto parent_pos = bc_[query.node_pos()].check();
      if (edge_size_(parent_pos, 2) != 1) {
        break;
      }
      if (WithNLM) {
        delete_sib_(query.node_pos());
      }
      unfix_(query.node_pos(), blocks_);
      query.prev(parent_pos);
      ++num_regress;
    }

    bc_[query.node_pos()].set_value(tail_size());
    while (0 < num_regress--) {
      tail_.push_back(*query.key());
      query.next();
    }
    tail_.push_back(*edge.begin());

    if (*edge.begin() != '\0') {
      while (tail_[value] != '\0') {
        tail_.push_back(tail_[value++]);
        ++tail_emps_;
      }
      tail_.push_back(tail_[value++]);
      ++tail_emps_;
      for (size_t i = 0; i < sizeof(uint32_t); ++i) {
        tail_.push_back(tail_[value++]);
        ++tail_emps_;
      }
    } else {
      for (size_t i = 0; i < sizeof(uint32_t); ++i) {
        tail_.push_back(static_cast<uint8_t>(value & 0xFF));
        value >>= 8;
      }
    }
  }